

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_regex_traits.hpp
# Opt level: O2

bool boost::xpressive::cpp_regex_traits<char>::compare_<char_const*>
               (char_type *name,char *begin,char *end)

{
  char cVar1;
  
  for (; (cVar1 = *name, cVar1 != '\0' && (begin != end)); begin = begin + 1) {
    if (cVar1 != *begin) {
      return false;
    }
    name = name + 1;
  }
  return begin == end && cVar1 == '\0';
}

Assistant:

static bool compare_(char_type const *name, FwdIter begin, FwdIter end)
    {
        for(; *name && begin != end; ++name, ++begin)
        {
            if(*name != *begin)
            {
                return false;
            }
        }
        return !*name && begin == end;
    }